

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall
cmCTestBuildHandler::RunMakeCommand
          (cmCTestBuildHandler *this,string *command,int *retVal,char *dir,int timeout,ostream *ofs,
          Encoding encoding)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  reference ppcVar6;
  cmsysProcess *cp_00;
  char **command_00;
  ostream *poVar7;
  size_t sVar8;
  ulong uVar9;
  void *pvVar10;
  reference ppcVar11;
  string local_1138 [32];
  undefined1 local_1118 [8];
  ostringstream cmCTestLog_msg_8;
  undefined1 local_fa0 [8];
  cmCTestBuildErrorWarning errorwarning_1;
  undefined1 local_ed0 [8];
  ostringstream cmCTestLog_msg_7;
  string local_d58 [32];
  undefined1 local_d38 [8];
  ostringstream cmCTestLog_msg_6;
  undefined1 local_bc0 [8];
  cmCTestBuildErrorWarning errorwarning;
  undefined1 local_af0 [8];
  ostringstream cmCTestLog_msg_5;
  string local_970 [4];
  int result;
  undefined1 local_950 [8];
  ostringstream cmCTestLog_msg_4;
  string local_7d8;
  string local_7b8;
  int local_798;
  int local_794;
  int cc;
  int res;
  undefined1 local_770 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_5f8 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_5d0;
  int length;
  char *data;
  size_type tick_len;
  size_type tick;
  cmsysProcess *cp;
  LaunchHelper launchHelper;
  ostringstream local_580 [8];
  ostringstream cmCTestLog_msg_2;
  string local_408 [32];
  undefined1 local_3e8 [8];
  ostringstream cmCTestLog_msg_1;
  char *arg_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1_1;
  undefined1 local_230 [8];
  ostringstream cmCTestLog_msg;
  value_type local_b8;
  value_type local_b0;
  reference local_a8;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_78 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostream *ofs_local;
  int timeout_local;
  char *dir_local;
  int *retVal_local;
  string *command_local;
  cmCTestBuildHandler *this_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ofs;
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,command);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
  if (bVar2) {
    this_local._4_4_ = 0;
    argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,sVar4 + 1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar2) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      local_b0 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,&local_b0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    local_b8 = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,&local_b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::operator<<((ostream *)local_230,"Run command:");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x315,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&__range1_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    __end1_1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    arg_1 = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                               *)&arg_1), bVar2) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end1_1);
      pcVar5 = *ppcVar6;
      if (pcVar5 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
      poVar7 = std::operator<<((ostream *)local_3e8," \"");
      poVar7 = std::operator<<(poVar7,pcVar5);
      std::operator<<(poVar7,"\"");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x31b,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_408);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end1_1);
    }
    std::__cxx11::ostringstream::ostringstream(local_580);
    std::ostream::operator<<(local_580,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x31e,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&launchHelper.CTest);
    std::__cxx11::ostringstream::~ostringstream(local_580);
    LaunchHelper::LaunchHelper((LaunchHelper *)&cp,this);
    cp_00 = cmsysProcess_New();
    tick = (size_type)cp_00;
    command_00 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    cmsysProcess_SetCommand(cp_00,command_00);
    cmsysProcess_SetWorkingDirectory((cmsysProcess *)tick,dir);
    cmsysProcess_SetOption((cmsysProcess *)tick,0,1);
    cmsysProcess_SetTimeout((cmsysProcess *)tick,(double)timeout);
    cmsysProcess_Execute((cmsysProcess *)tick);
    tick_len = 0;
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
    std::__cxx11::string::string((string *)local_5f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
    poVar7 = std::operator<<((ostream *)local_770,"   Each symbol represents ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x400);
    poVar7 = std::operator<<(poVar7," bytes of output.");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pcVar5 = "   \'!\' represents an error and \'*\' a warning.\n";
    if ((this->UseCTestLaunch & 1U) != 0) {
      pcVar5 = "";
    }
    poVar7 = std::operator<<(poVar7,pcVar5);
    poVar7 = std::operator<<(poVar7,"    ");
    std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x33c,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&cc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
    std::deque<char,_std::allocator<char>_>::clear(&this->BuildProcessingQueue);
    this->OutputLineCounter = 0;
    std::
    vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
    ::clear(&this->ErrorsAndWarnings);
    this->TotalErrors = 0;
    this->TotalWarnings = 0;
    this->BuildOutputLogSize = 0;
    this->LastTickChar = '.';
    this->WarningQuotaReached = false;
    this->ErrorQuotaReached = false;
    while (local_794 = cmsysProcess_WaitForData
                                 ((cmsysProcess *)tick,&stack0xfffffffffffffa30,
                                  (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0),
          local_794 != 0) {
      for (local_798 = 0; local_798 < (int)strdata.field_2._12_4_; local_798 = local_798 + 1) {
        if (pcStack_5d0[local_798] == '\0') {
          pcStack_5d0[local_798] = '\n';
        }
      }
      if (local_794 == 3) {
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_5d0,
                   (long)(int)strdata.field_2._12_4_,(string *)local_5f8,1);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        sVar8 = std::__cxx11::string::size();
        ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                      (ostream *)
                      args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      &this->BuildProcessingErrorQueue);
      }
      else {
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_5d0,
                   (long)(int)strdata.field_2._12_4_,(string *)local_5f8,2);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        sVar8 = std::__cxx11::string::size();
        ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                      (ostream *)
                      args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->BuildProcessingQueue
                     );
      }
    }
    std::__cxx11::string::string((string *)&local_7b8);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_7b8,
               (string *)local_5f8,1);
    std::__cxx11::string::~string((string *)&local_7b8);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      sVar8 = std::__cxx11::string::size();
      ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                    (ostream *)
                    args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    &this->BuildProcessingErrorQueue);
    }
    std::__cxx11::string::string((string *)&local_7d8);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_7d8,
               (string *)local_5f8,2);
    std::__cxx11::string::~string((string *)&local_7d8);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      sVar8 = std::__cxx11::string::size();
      ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                    (ostream *)
                    args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->BuildProcessingQueue);
    }
    ProcessBuffer(this,(char *)0x0,0,&tick_len,0x400,
                  (ostream *)
                  args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->BuildProcessingQueue);
    ProcessBuffer(this,(char *)0x0,0,&tick_len,0x400,
                  (ostream *)
                  args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  &this->BuildProcessingErrorQueue);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_950);
    poVar7 = std::operator<<((ostream *)local_950," Size of output: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->BuildOutputLogSize + 0x200 >> 10);
    poVar7 = std::operator<<(poVar7,"K");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x372,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_970);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_950);
    cmsysProcess_WaitForExit((cmsysProcess *)tick,(double *)0x0);
    this_local._4_4_ = cmsysProcess_GetState((cmsysProcess *)tick);
    if (this_local._4_4_ == 4) {
      if (retVal != (int *)0x0) {
        iVar3 = cmsysProcess_GetExitValue((cmsysProcess *)tick);
        *retVal = iVar3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_af0);
        poVar7 = std::operator<<((ostream *)local_af0,"Command exited with the value: ");
        pvVar10 = (void *)std::ostream::operator<<(poVar7,*retVal);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x37e,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(errorwarning.PostContext.field_2._M_local_buf + 8))
        ;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_af0);
        if (*retVal != 0) {
          cmCTestBuildErrorWarning::cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_bc0);
          local_bc0._4_4_ = 1;
          std::__cxx11::string::operator=
                    ((string *)&errorwarning,"*** WARNING non-zero return value in ctest from: ");
          ppcVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                               ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,0);
          std::__cxx11::string::operator+=((string *)&errorwarning,*ppcVar11);
          std::__cxx11::string::clear();
          std::__cxx11::string::clear();
          local_bc0[0] = false;
          std::
          vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
          ::push_back(&this->ErrorsAndWarnings,(value_type *)local_bc0);
          this->TotalWarnings = this->TotalWarnings + 1;
          cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_bc0)
          ;
        }
      }
    }
    else if (this_local._4_4_ == 2) {
      if (retVal != (int *)0x0) {
        iVar3 = cmsysProcess_GetExitException((cmsysProcess *)tick);
        *retVal = iVar3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d38);
        poVar7 = std::operator<<((ostream *)local_d38,"There was an exception: ");
        pvVar10 = (void *)std::ostream::operator<<(poVar7,*retVal);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x394,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_d58);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d38);
      }
    }
    else if (this_local._4_4_ == 5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ed0);
      poVar7 = std::operator<<((ostream *)local_ed0,"There was a timeout");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x398,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)(errorwarning_1.PostContext.field_2._M_local_buf + 8))
      ;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ed0);
    }
    else if (this_local._4_4_ == 1) {
      cmCTestBuildErrorWarning::cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_fa0);
      local_fa0._4_4_ = 1;
      std::__cxx11::string::operator=((string *)&errorwarning_1,"*** ERROR executing: ");
      pcVar5 = cmsysProcess_GetErrorString((cmsysProcess *)tick);
      std::__cxx11::string::operator+=((string *)&errorwarning_1,pcVar5);
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      local_fa0[0] = true;
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::push_back(&this->ErrorsAndWarnings,(value_type *)local_fa0);
      this->TotalErrors = this->TotalErrors + 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1118);
      poVar7 = std::operator<<((ostream *)local_1118,"There was an error: ");
      pcVar5 = cmsysProcess_GetErrorString((cmsysProcess *)tick);
      poVar7 = std::operator<<(poVar7,pcVar5);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x3a6,pcVar5,false);
      std::__cxx11::string::~string(local_1138);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1118);
      cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_fa0);
    }
    cmsysProcess_Delete((cmsysProcess *)tick);
    argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_5f8);
    cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
    LaunchHelper::~LaunchHelper((LaunchHelper *)&cp);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::RunMakeCommand(const std::string& command,
                                        int* retVal, const char* dir,
                                        int timeout, std::ostream& ofs,
                                        Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    argv.push_back(arg.c_str());
  }
  argv.push_back(nullptr);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Run command:", this->Quiet);
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " \"" << arg << "\"", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                     this->Quiet);

  // Optionally use make rule launchers to record errors and warnings.
  LaunchHelper launchHelper(this);
  static_cast<void>(launchHelper);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  const std::string::size_type tick_len = 1024;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestOptionalLog(
    this->CTest, HANDLER_PROGRESS_OUTPUT,
    "   Each symbol represents "
      << tick_len << " bytes of output." << std::endl
      << (this->UseCTestLaunch
            ? ""
            : "   '!' represents an error and '*' a warning.\n")
      << "    " << std::flush,
    this->Quiet);

  // Initialize building structures
  this->BuildProcessingQueue.clear();
  this->OutputLineCounter = 0;
  this->ErrorsAndWarnings.clear();
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->WarningQuotaReached = false;
  this->ErrorQuotaReached = false;

  // For every chunk of data
  int res;
  while ((res = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Replace '\0' with '\n', since '\0' does not really make sense. This is
    // for Visual Studio output
    for (int cc = 0; cc < length; ++cc) {
      if (data[cc] == 0) {
        data[cc] = '\n';
      }
    }

    // Process the chunk of data
    if (res == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 1);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingErrorQueue);
    } else {
      processOutput.DecodeText(data, length, strdata, 2);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingQueue);
    }
  }
  processOutput.DecodeText(std::string(), strdata, 1);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingErrorQueue);
  }
  processOutput.DecodeText(std::string(), strdata, 2);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingQueue);
  }

  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingQueue);
  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingErrorQueue);
  cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                     " Size of output: "
                       << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                       << std::endl,
                     this->Quiet);

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Command exited with the value: " << *retVal
                                                           << std::endl,
                         this->Quiet);
      // if a non zero return value
      if (*retVal) {
        // If there was an error running command, report that on the
        // dashboard.
        cmCTestBuildErrorWarning errorwarning;
        errorwarning.LogLine = 1;
        errorwarning.Text =
          "*** WARNING non-zero return value in ctest from: ";
        errorwarning.Text += argv[0];
        errorwarning.PreContext.clear();
        errorwarning.PostContext.clear();
        errorwarning.Error = false;
        this->ErrorsAndWarnings.push_back(std::move(errorwarning));
        this->TotalWarnings++;
      }
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitException(cp);
      cmCTestOptionalLog(this->CTest, WARNING,
                         "There was an exception: " << *retVal << std::endl,
                         this->Quiet);
    }
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "There was a timeout" << std::endl, this->Quiet);
  } else if (result == cmsysProcess_State_Error) {
    // If there was an error running command, report that on the dashboard.
    cmCTestBuildErrorWarning errorwarning;
    errorwarning.LogLine = 1;
    errorwarning.Text = "*** ERROR executing: ";
    errorwarning.Text += cmsysProcess_GetErrorString(cp);
    errorwarning.PreContext.clear();
    errorwarning.PostContext.clear();
    errorwarning.Error = true;
    this->ErrorsAndWarnings.push_back(std::move(errorwarning));
    this->TotalErrors++;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);
  return result;
}